

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testCopyPixels.cpp
# Opt level: O1

void anon_unknown.dwarf_103193::writeCopyRead
               (string *tempDir,Array2D<Imath_3_2::half> *ph,int w,int h,int dx,int dy)

{
  ulong uVar1;
  float fVar2;
  pointer pcVar3;
  _Alloc_hider __filename;
  _Alloc_hider __filename_00;
  char cVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  ostream *poVar8;
  int *piVar9;
  char *pcVar10;
  Header *pHVar11;
  long lVar12;
  void *pvVar13;
  void *pvVar14;
  undefined8 *puVar15;
  undefined8 *puVar16;
  float *pfVar17;
  float *pfVar18;
  ChannelList *this;
  ChannelList *pCVar19;
  undefined4 uVar20;
  undefined4 in_register_0000000c;
  void *pvVar21;
  ulong uVar22;
  void *pvVar23;
  ulong uVar24;
  undefined4 in_register_00000084;
  ulong uVar25;
  undefined4 in_register_0000008c;
  long lVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  int iVar31;
  int iVar32;
  int iVar33;
  int local_1f8;
  FrameBuffer fb;
  InputFile in2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_198;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_188;
  string filename2;
  string filename1;
  FrameBuffer fb2;
  InputFile in1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_c0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_b0;
  OutputFile out;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_90;
  Header hdr;
  
  filename1._M_dataplus._M_p = (pointer)&filename1.field_2;
  pcVar3 = (tempDir->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&filename1,pcVar3,pcVar3 + tempDir->_M_string_length,
             CONCAT44(in_register_0000000c,h),CONCAT44(in_register_00000084,dx),
             CONCAT44(in_register_0000008c,dy));
  std::__cxx11::string::append((char *)&filename1);
  filename2._M_dataplus._M_p = (pointer)&filename2.field_2;
  pcVar3 = (tempDir->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&filename2,pcVar3,pcVar3 + tempDir->_M_string_length);
  std::__cxx11::string::append((char *)&filename2);
  local_1f8 = 0;
  while( true ) {
    __filename_00._M_p = filename1._M_dataplus._M_p;
    __filename._M_p = filename2._M_dataplus._M_p;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"compression ",0xc);
    poVar8 = (ostream *)std::ostream::operator<<(&std::cout,local_1f8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,":",1);
    std::ostream::flush();
    _out = 0;
    fb2._map._M_t._M_impl._0_8_ = 0;
    fb._map._M_t._M_impl._0_4_ = w;
    fb._map._M_t._M_impl._4_4_ = h;
    fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = w + 0x172;
    fb._map._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = h + 0x22e;
    Imf_3_4::Header::Header
              (&hdr,(Box *)&out,(Box *)&fb,1.0,(Vec2 *)&fb2,1.0,INCREASING_Y,ZIP_COMPRESSION);
    piVar9 = (int *)Imf_3_4::Header::compression();
    *piVar9 = local_1f8;
    pcVar10 = (char *)Imf_3_4::Header::channels();
    Imf_3_4::Channel::Channel((Channel *)&out,HALF,1,1,false);
    Imf_3_4::ChannelList::insert(pcVar10,(Channel *)0x1c412f);
    fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &fb._map._M_t._M_impl.super__Rb_tree_header._M_header;
    fb._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    Imf_3_4::Slice::Slice
              ((Slice *)&out,HALF,(char *)(ph->_data + ph->_sizeY * (long)-h + (long)-w),2,0x2e6,1,1
               ,0.0,false,false);
    Imf_3_4::FrameBuffer::insert((char *)&fb,(Slice *)0x1c412f);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," writing",8);
    std::ostream::flush();
    remove(__filename_00._M_p);
    iVar5 = Imf_3_4::globalThreadCount();
    Imf_3_4::OutputFile::OutputFile(&out,__filename_00._M_p,&hdr,iVar5);
    Imf_3_4::OutputFile::setFrameBuffer((FrameBuffer *)&out);
    Imf_3_4::OutputFile::writePixels((int)(Channel *)&out);
    Imf_3_4::OutputFile::~OutputFile(&out);
    std::
    _Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
    ::~_Rb_tree((_Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
                 *)&fb);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," copying",8);
    std::ostream::flush();
    remove(__filename._M_p);
    iVar5 = Imf_3_4::globalThreadCount();
    Imf_3_4::InputFile::InputFile((InputFile *)&out,__filename_00._M_p,iVar5);
    pHVar11 = (Header *)Imf_3_4::InputFile::header();
    iVar5 = Imf_3_4::globalThreadCount();
    Imf_3_4::OutputFile::OutputFile((OutputFile *)&fb,__filename._M_p,pHVar11,iVar5);
    Imf_3_4::OutputFile::copyPixels((InputFile *)&fb);
    Imf_3_4::OutputFile::~OutputFile((OutputFile *)&fb);
    if (local_90 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_90);
    }
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x22e00000172);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," reading",8);
    std::ostream::flush();
    iVar5 = Imf_3_4::globalThreadCount();
    Imf_3_4::InputFile::InputFile(&in1,__filename_00._M_p,iVar5);
    iVar5 = Imf_3_4::globalThreadCount();
    Imf_3_4::InputFile::InputFile(&in2,__filename._M_p,iVar5);
    Imf_3_4::InputFile::header();
    piVar9 = (int *)Imf_3_4::Header::dataWindow();
    iVar5 = piVar9[2];
    lVar26 = (long)*piVar9;
    uVar1 = (iVar5 - lVar26) + 1;
    iVar31 = piVar9[1];
    iVar6 = piVar9[3] - iVar31;
    uVar7 = iVar6 + 1;
    lVar12 = (long)(int)uVar7 * uVar1;
    uVar22 = lVar12 * 2;
    if (lVar12 < 0) {
      uVar22 = 0xffffffffffffffff;
    }
    pvVar13 = operator_new__(uVar22);
    pvVar14 = operator_new__(uVar22);
    fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &fb._map._M_t._M_impl.super__Rb_tree_header._M_header;
    fb._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    fb2._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    fb2._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    fb2._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &fb2._map._M_t._M_impl.super__Rb_tree_header._M_header;
    fb2._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    lVar12 = (long)-iVar31 * uVar1;
    uVar22 = uVar1 * 2;
    fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    fb2._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         fb2._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    Imf_3_4::Slice::Slice
              ((Slice *)&out,HALF,(char *)((long)pvVar13 + lVar26 * -2 + lVar12 * 2),2,uVar22,1,1,
               0.0,false,false);
    Imf_3_4::FrameBuffer::insert((char *)&fb,(Slice *)0x1c412f);
    uVar20 = 2;
    Imf_3_4::Slice::Slice
              ((Slice *)&out,HALF,(char *)((long)pvVar14 + lVar26 * -2 + lVar12 * 2),2,uVar22,1,1,
               0.0,false,false);
    Imf_3_4::FrameBuffer::insert((char *)&fb2,(Slice *)0x1c412f);
    Imf_3_4::InputFile::setFrameBuffer((FrameBuffer *)&in1);
    Imf_3_4::InputFile::readPixels((int)&in1,piVar9[1]);
    Imf_3_4::InputFile::setFrameBuffer((FrameBuffer *)&in2);
    Imf_3_4::InputFile::readPixels((int)&in2,piVar9[1]);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," comparing",10);
    std::ostream::flush();
    Imf_3_4::InputFile::header();
    puVar15 = (undefined8 *)Imf_3_4::Header::displayWindow();
    puVar16 = (undefined8 *)Imf_3_4::Header::displayWindow();
    iVar31 = -(uint)((int)*puVar16 == (int)*puVar15);
    iVar32 = -(uint)((int)((ulong)*puVar16 >> 0x20) == (int)((ulong)*puVar15 >> 0x20));
    auVar27._4_4_ = iVar31;
    auVar27._0_4_ = iVar31;
    auVar27._8_4_ = iVar32;
    auVar27._12_4_ = iVar32;
    iVar31 = movmskpd(uVar20,auVar27);
    if ((iVar31 != 3) ||
       (iVar32 = -(uint)((int)puVar16[1] == (int)puVar15[1]),
       iVar33 = -(uint)((int)((ulong)puVar16[1] >> 0x20) == (int)((ulong)puVar15[1] >> 0x20)),
       auVar28._4_4_ = iVar32, auVar28._0_4_ = iVar32, auVar28._8_4_ = iVar33,
       auVar28._12_4_ = iVar33, iVar32 = movmskpd((int)puVar16,auVar28), iVar32 != 3)) {
      __assert_fail("in2.header ().displayWindow () == hdr.displayWindow ()",
                    "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testCopyPixels.cpp"
                    ,0x92,
                    "void (anonymous namespace)::writeCopyRead(const Array2D<half> &, const char *, const char *, int, int, int, int, Compression)"
                   );
    }
    Imf_3_4::InputFile::header();
    puVar15 = (undefined8 *)Imf_3_4::Header::dataWindow();
    puVar16 = (undefined8 *)Imf_3_4::Header::dataWindow();
    iVar32 = -(uint)((int)*puVar16 == (int)*puVar15);
    iVar33 = -(uint)((int)((ulong)*puVar16 >> 0x20) == (int)((ulong)*puVar15 >> 0x20));
    auVar29._4_4_ = iVar32;
    auVar29._0_4_ = iVar32;
    auVar29._8_4_ = iVar33;
    auVar29._12_4_ = iVar33;
    iVar31 = movmskpd(iVar31,auVar29);
    if ((iVar31 != 3) ||
       (iVar31 = -(uint)((int)puVar16[1] == (int)puVar15[1]),
       iVar32 = -(uint)((int)((ulong)puVar16[1] >> 0x20) == (int)((ulong)puVar15[1] >> 0x20)),
       auVar30._4_4_ = iVar31, auVar30._0_4_ = iVar31, auVar30._8_4_ = iVar32,
       auVar30._12_4_ = iVar32, iVar31 = movmskpd((int)puVar16,auVar30), iVar31 != 3)) {
      __assert_fail("in2.header ().dataWindow () == hdr.dataWindow ()",
                    "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testCopyPixels.cpp"
                    ,0x93,
                    "void (anonymous namespace)::writeCopyRead(const Array2D<half> &, const char *, const char *, int, int, int, int, Compression)"
                   );
    }
    Imf_3_4::InputFile::header();
    pfVar17 = (float *)Imf_3_4::Header::pixelAspectRatio();
    fVar2 = *pfVar17;
    pfVar17 = (float *)Imf_3_4::Header::pixelAspectRatio();
    if ((fVar2 != *pfVar17) || (NAN(fVar2) || NAN(*pfVar17))) break;
    Imf_3_4::InputFile::header();
    pfVar17 = (float *)Imf_3_4::Header::screenWindowCenter();
    pfVar18 = (float *)Imf_3_4::Header::screenWindowCenter();
    if ((((*pfVar17 != *pfVar18) || (NAN(*pfVar17) || NAN(*pfVar18))) || (pfVar17[1] != pfVar18[1]))
       || (NAN(pfVar17[1]) || NAN(pfVar18[1]))) {
      __assert_fail("in2.header ().screenWindowCenter () == hdr.screenWindowCenter ()",
                    "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testCopyPixels.cpp"
                    ,0x96,
                    "void (anonymous namespace)::writeCopyRead(const Array2D<half> &, const char *, const char *, int, int, int, int, Compression)"
                   );
    }
    Imf_3_4::InputFile::header();
    pfVar17 = (float *)Imf_3_4::Header::screenWindowWidth();
    fVar2 = *pfVar17;
    pfVar17 = (float *)Imf_3_4::Header::screenWindowWidth();
    if ((fVar2 != *pfVar17) || (NAN(fVar2) || NAN(*pfVar17))) {
      __assert_fail("in2.header ().screenWindowWidth () == hdr.screenWindowWidth ()",
                    "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testCopyPixels.cpp"
                    ,0x97,
                    "void (anonymous namespace)::writeCopyRead(const Array2D<half> &, const char *, const char *, int, int, int, int, Compression)"
                   );
    }
    Imf_3_4::InputFile::header();
    piVar9 = (int *)Imf_3_4::Header::lineOrder();
    iVar31 = *piVar9;
    piVar9 = (int *)Imf_3_4::Header::lineOrder();
    if (iVar31 != *piVar9) {
      __assert_fail("in2.header ().lineOrder () == hdr.lineOrder ()",
                    "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testCopyPixels.cpp"
                    ,0x98,
                    "void (anonymous namespace)::writeCopyRead(const Array2D<half> &, const char *, const char *, int, int, int, int, Compression)"
                   );
    }
    Imf_3_4::InputFile::header();
    piVar9 = (int *)Imf_3_4::Header::compression();
    iVar31 = *piVar9;
    piVar9 = (int *)Imf_3_4::Header::compression();
    if (iVar31 != *piVar9) {
      __assert_fail("in2.header ().compression () == hdr.compression ()",
                    "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testCopyPixels.cpp"
                    ,0x99,
                    "void (anonymous namespace)::writeCopyRead(const Array2D<half> &, const char *, const char *, int, int, int, int, Compression)"
                   );
    }
    Imf_3_4::InputFile::header();
    this = (ChannelList *)Imf_3_4::Header::channels();
    pCVar19 = (ChannelList *)Imf_3_4::Header::channels();
    cVar4 = Imf_3_4::ChannelList::operator==(this,pCVar19);
    if (cVar4 == '\0') {
      __assert_fail("in2.header ().channels () == hdr.channels ()",
                    "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testCopyPixels.cpp"
                    ,0x9a,
                    "void (anonymous namespace)::writeCopyRead(const Array2D<half> &, const char *, const char *, int, int, int, int, Compression)"
                   );
    }
    if (-1 < iVar6) {
      uVar24 = 0;
      pvVar21 = pvVar13;
      pvVar23 = pvVar14;
      do {
        if (-1 < (int)(iVar5 - lVar26)) {
          uVar25 = 0;
          do {
            fVar2 = *(float *)(_imath_half_to_float_table +
                              (ulong)*(ushort *)((long)pvVar21 + uVar25 * 2) * 4);
            pfVar17 = (float *)(_imath_half_to_float_table +
                               (ulong)*(ushort *)((long)pvVar23 + uVar25 * 2) * 4);
            if ((fVar2 != *pfVar17) || (NAN(fVar2) || NAN(*pfVar17))) {
              __assert_fail("ph1[y][x] == ph2[y][x]",
                            "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testCopyPixels.cpp"
                            ,0x9e,
                            "void (anonymous namespace)::writeCopyRead(const Array2D<half> &, const char *, const char *, int, int, int, int, Compression)"
                           );
            }
            uVar25 = uVar25 + 1;
          } while ((uVar1 & 0xffffffff) != uVar25);
        }
        uVar24 = uVar24 + 1;
        pvVar23 = (void *)((long)pvVar23 + uVar22);
        pvVar21 = (void *)((long)pvVar21 + uVar22);
      } while (uVar24 != uVar7);
    }
    std::
    _Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
    ::~_Rb_tree((_Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
                 *)&fb2);
    std::
    _Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
    ::~_Rb_tree((_Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
                 *)&fb);
    operator_delete__(pvVar14);
    operator_delete__(pvVar13);
    if (local_188 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_188);
    }
    if (local_198 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_198);
    }
    if (local_b0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_b0);
    }
    if (local_c0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_c0);
    }
    remove(__filename_00._M_p);
    remove(__filename._M_p);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
    std::ostream::put(-0x60);
    std::ostream::flush();
    Imf_3_4::Header::~Header(&hdr);
    local_1f8 = local_1f8 + 1;
    if (local_1f8 == 10) {
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)filename2._M_dataplus._M_p != &filename2.field_2) {
        operator_delete(filename2._M_dataplus._M_p,filename2.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)filename1._M_dataplus._M_p != &filename1.field_2) {
        operator_delete(filename1._M_dataplus._M_p,filename1.field_2._M_allocated_capacity + 1);
      }
      return;
    }
  }
  __assert_fail("in2.header ().pixelAspectRatio () == hdr.pixelAspectRatio ()",
                "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testCopyPixels.cpp"
                ,0x94,
                "void (anonymous namespace)::writeCopyRead(const Array2D<half> &, const char *, const char *, int, int, int, int, Compression)"
               );
}

Assistant:

void
writeCopyRead (
    const std::string&   tempDir,
    const Array2D<half>& ph,
    int                  w,
    int                  h,
    int                  dx,
    int                  dy)
{
    std::string filename1 = tempDir + "imf_test_copy1.exr";
    std::string filename2 = tempDir + "imf_test_copy2.exr";

    for (int comp = 0; comp < NUM_COMPRESSION_METHODS; ++comp)
    {
        writeCopyRead (
            ph,
            filename1.c_str (),
            filename2.c_str (),
            w,
            h,
            dx,
            dy,
            Compression (comp));
    }
}